

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_test.c
# Opt level: O2

void vdpp_test_help(void)

{
  _mpp_log_l(4,"vdpp_test","usage: vdpp_test [options]\n",0);
  _mpp_log_l(4,"vdpp_test","*******************************\n",0);
  _show_options(0x1b,vdpp_test_cmd);
  mpp_show_color_format();
  _mpp_log_l(4,"vdpp_test","*******************************\n",0);
  _mpp_log_l(4,"vdpp_test","supported ASCII format strings:\n",0);
  _mpp_log_l(4,"vdpp_test","1 - yuv444\n",0);
  _mpp_log_l(4,"vdpp_test","2 - yuv420 \n",0);
  _mpp_log_l(4,"vdpp_test","************ sample ***********\n",0);
  _mpp_log_l(4,"vdpp_test",
             "vdpp_test -w 720 -h 480 -s 0 -i input.yuv -W 1920 -H 1080 -F yuv444 -S 0 -o output.yuv -n 1\n"
             ,0);
  return;
}

Assistant:

static void vdpp_test_help()
{
    mpp_log("usage: vdpp_test [options]\n");
    mpp_log("*******************************\n");
    show_options(vdpp_test_cmd);
    mpp_show_color_format();
    mpp_log("*******************************\n");
    mpp_log("supported ASCII format strings:\n");
    mpp_log("1 - yuv444\n");
    mpp_log("2 - yuv420 \n");
    mpp_log("************ sample ***********\n");
    mpp_log("vdpp_test -w 720 -h 480 -s 0 -i input.yuv -W 1920 -H 1080 -F yuv444 -S 0 -o output.yuv -n 1\n");
}